

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

iterator * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::prior
          (iterator *this)

{
  ulong uVar1;
  undefined1 uVar2;
  stack_entry *psVar3;
  node_ptr node;
  iterator *piVar4;
  node_type type;
  undefined1 local_50 [8];
  iter_result_opt_conflict nxt;
  
  while( true ) {
    if ((this->stack_).c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->stack_).c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      return this;
    }
    psVar3 = top(this);
    uVar1 = (psVar3->node).tagged_ptr;
    if (uVar1 == 0) break;
    type = (node_type)uVar1 & (I256|I48);
    if ((uVar1 & 7) == 0) {
      pop(this);
    }
    else {
      detail::
      basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      ::prior((iter_result_opt_conflict *)local_50,
              (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               *)(uVar1 & 0xfffffffffffffff8),type,psVar3->child_index);
      uVar2 = nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
              _M_payload._16_1_;
      pop(this);
      if (uVar2 == '\x01') {
        push(this,(iter_result *)local_50);
        node = detail::
               basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                            *)(uVar1 & 0xfffffffffffffff8),type,
                           nxt.
                           super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                           ._M_payload._M_value.node.tagged_ptr._1_1_);
        piVar4 = right_most_traversal(this,(node_ptr)node.tagged_ptr);
        return piVar4;
      }
    }
  }
  __assert_fail("node != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                ,0x454,
                "typename db<Key, Value>::iterator &unodb::db<unsigned long, std::span<const std::byte>>::iterator::prior() [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::prior() {
  while (!empty()) {
    const auto& e = top();
    const auto node{e.node};
    UNODB_DETAIL_ASSERT(node != nullptr);
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      pop();     // pop off the leaf
      continue;  // falls through loop if just a root leaf since stack now
                 // empty.
    }
    auto* inode{node.template ptr<inode_type*>()};
    auto nxt = inode->prior(node_type, e.child_index);  // parent's prev child
    if (!nxt) {
      pop();     // Nothing more for that inode.
      continue;  // We will look for the left sibling of the parent inode.
    }
    // Fix up stack for new parent node state and right-most descent.
    UNODB_DETAIL_ASSERT(nxt.has_value());  // value exists for std::optional
    const auto& e2 = nxt.value();
    pop();
    push(e2);
    auto child = inode->get_child(node_type, e2.child_index);  // descend
    return right_most_traversal(child);
  }
  return *this;  // stack is empty, so iterator == end().
}